

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel_internal.h
# Opt level: O2

void __thiscall
embree::sse2::__internal_two_level_builder__::
MeshBuilder<4,_embree::TriangleMesh,_embree::TriangleMv<4>_>::operator()
          (MeshBuilder<4,_embree::TriangleMesh,_embree::TriangleMv<4>_> *this,void *bvh,
          TriangleMesh *mesh,size_t geomID,GTypeMask gtype,bool useMortonBuilder,Builder **builder)

{
  ushort uVar1;
  uint uVar2;
  Builder *pBVar3;
  undefined8 *puVar4;
  uint geomID_00;
  undefined3 in_register_00000089;
  allocator local_39;
  string local_38 [32];
  
  geomID_00 = (uint)geomID;
  if (CONCAT31(in_register_00000089,useMortonBuilder) == 0) {
    uVar1 = *(ushort *)&(mesh->super_Geometry).field_8.field_0x2;
    uVar2 = uVar1 & 7;
    if (uVar2 - 1 < 2) {
      pBVar3 = BVH4Triangle4vMeshBuilderSAH(bvh,mesh,geomID_00,0);
      goto LAB_0051abc2;
    }
    if (uVar2 == 3) {
      pBVar3 = BVH4Triangle4vMeshRefitSAH(bvh,mesh,geomID_00,0);
      goto LAB_0051abc2;
    }
    if ((uVar1 & 7) != 0) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string(local_38,"invalid build quality",&local_39);
      *puVar4 = &PTR__rtcore_error_021d38e0;
      *(undefined4 *)(puVar4 + 1) = 1;
      std::__cxx11::string::string((string *)(puVar4 + 2),local_38);
      __cxa_throw(puVar4,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
  }
  pBVar3 = BVH4Triangle4vMeshBuilderMortonGeneral(bvh,mesh,geomID_00,0);
LAB_0051abc2:
  *builder = pBVar3;
  return;
}

Assistant:

void operator () (void* bvh, Mesh* mesh, size_t geomID, Geometry::GTypeMask gtype, bool useMortonBuilder, Builder*& builder) {
          if(useMortonBuilder) {
            builder = MortonBuilder<N,Mesh,Primitive>()(bvh,mesh,geomID,gtype);
            return;
          }
          switch (mesh->quality) {
            case RTC_BUILD_QUALITY_LOW:    builder = MortonBuilder<N,Mesh,Primitive>()(bvh,mesh,geomID,gtype); break;
            case RTC_BUILD_QUALITY_MEDIUM:
            case RTC_BUILD_QUALITY_HIGH:   builder = SAHBuilder<N,Mesh,Primitive>()(bvh,mesh,geomID,gtype); break;
            case RTC_BUILD_QUALITY_REFIT:  builder = RefitBuilder<N,Mesh,Primitive>()(bvh,mesh,geomID,gtype); break;
            default: throw_RTCError(RTC_ERROR_UNKNOWN,"invalid build quality");
          }
        }